

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall
cmFileLockPool::ScopePool::Lock(ScopePool *this,string *filename,unsigned_long timeoutSec)

{
  pointer *pppcVar1;
  iterator __position;
  bool bVar2;
  cmFileLock *pcVar3;
  cmFileLock *lock;
  cmFileLockResult result;
  cmFileLock *local_30;
  cmFileLockResult local_28;
  
  pcVar3 = (cmFileLock *)operator_new(0x28);
  cmFileLock::cmFileLock(pcVar3);
  local_30 = pcVar3;
  local_28 = cmFileLock::Lock(pcVar3,filename,timeoutSec);
  bVar2 = cmFileLockResult::IsOk(&local_28);
  pcVar3 = local_30;
  if (bVar2) {
    __position._M_current =
         (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmFileLock*,std::allocator<cmFileLock*>>::_M_realloc_insert<cmFileLock*const&>
                ((vector<cmFileLock*,std::allocator<cmFileLock*>> *)this,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppcVar1 = &(this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
    local_28 = cmFileLockResult::MakeOk();
  }
  else if (local_30 != (cmFileLock *)0x0) {
    cmFileLock::~cmFileLock(local_30);
    operator_delete(pcVar3,0x28);
  }
  return local_28;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Lock(const std::string& filename,
                                                 unsigned long timeoutSec)
{
  cmFileLock* lock = new cmFileLock();
  const cmFileLockResult result = lock->Lock(filename, timeoutSec);
  if (result.IsOk()) {
    this->Locks.push_back(lock);
    return cmFileLockResult::MakeOk();
  }
  delete lock;
  return result;
}